

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O0

bool __thiscall lr_grammar::GrammarLR::sim(GrammarLR *this,char *testString)

{
  Type TVar1;
  byte bVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  ulong uVar8;
  size_type sVar9;
  reference pvVar10;
  undefined8 uVar11;
  reference pvVar12;
  reference pvVar13;
  Express *pEVar14;
  int *piVar15;
  bool bVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8 [32];
  string local_6a8 [32];
  string local_688 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648 [32];
  string local_628 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8 [36];
  int local_5c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0 [4];
  int i_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0 [36];
  int local_57c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578 [4];
  int i_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558 [32];
  string local_538 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518 [32];
  string local_4f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8 [36];
  int local_494;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490 [4];
  int i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450 [32];
  int local_430;
  byte local_429;
  int i;
  string local_408 [36];
  int local_3e4;
  int iStack_3e0;
  int st;
  ReduceByExpress r;
  string local_3d0 [32];
  value_type local_3b0;
  stackElem e;
  string local_3a0 [4];
  int ipIndex;
  string text;
  string local_380 [8];
  string tmp;
  long local_360;
  stringstream sstream;
  ostream local_350 [376];
  char local_1d8 [8];
  char buffer [200];
  string bufS;
  char local_f0 [8];
  char formatC [15];
  char formatS [6];
  vector<stackElem,_std::allocator<stackElem>_> elemprint;
  stack<stackElem,_std::deque<stackElem,_std::allocator<stackElem>_>_> s;
  allocator local_59;
  string local_58 [32];
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ipString;
  bool result;
  char *testString_local;
  GrammarLR *this_local;
  
  ipString.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,testString,&local_59);
  public_tool::parse_elem
            ((string *)local_58,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::stack<stackElem,std::deque<stackElem,std::allocator<stackElem>>>::
  stack<std::deque<stackElem,std::allocator<stackElem>>,void>
            ((stack<stackElem,std::deque<stackElem,std::allocator<stackElem>>> *)
             &elemprint.super__Vector_base<stackElem,_std::allocator<stackElem>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<stackElem,_std::allocator<stackElem>_>::vector
            ((vector<stackElem,_std::allocator<stackElem>_> *)formatS);
  builtin_strncpy(formatC + 8,"%-25s",6);
  builtin_strncpy(formatC,"      ",7);
  builtin_strncpy(local_f0,"%+15s   ",8);
  std::__cxx11::string::string((string *)(buffer + 0xc0));
  std::__cxx11::stringstream::stringstream((stringstream *)&local_360);
  std::__cxx11::string::string(local_380);
  std::__cxx11::string::string(local_3a0);
  e.elemKey = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d0,"#",(allocator *)((long)&r.expressIndex + 3));
  local_3b0.elemKey = find_name(this,(string *)local_3d0);
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&r.expressIndex + 3));
  local_3b0 = (value_type)((ulong)(uint)local_3b0.elemKey << 0x20);
  std::stack<stackElem,_std::deque<stackElem,_std::allocator<stackElem>_>_>::push
            ((stack<stackElem,_std::deque<stackElem,_std::allocator<stackElem>_>_> *)
             &elemprint.super__Vector_base<stackElem,_std::allocator<stackElem>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_3b0);
  std::vector<stackElem,_std::allocator<stackElem>_>::push_back
            ((vector<stackElem,_std::allocator<stackElem>_> *)formatS,&local_3b0);
  while( true ) {
    pvVar4 = std::
             vector<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
             ::operator[](&this->action_table,(long)local_3b0.states);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_38,(long)e.elemKey);
    local_429 = 0;
    std::__cxx11::string::string(local_408,(string *)pvVar5);
    iVar3 = find_name(this,(string *)local_408);
    pvVar6 = std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>::operator[]
                       (pvVar4,(long)iVar3);
    bVar16 = true;
    if (pvVar6->type != REDUCE) {
      pvVar4 = std::
               vector<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
               ::operator[](&this->action_table,(long)local_3b0.states);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_38,(long)e.elemKey);
      std::__cxx11::string::string((string *)&i,(string *)pvVar5);
      local_429 = 1;
      iVar3 = find_name(this,(string *)&i);
      pvVar6 = std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>::operator[]
                         (pvVar4,(long)iVar3);
      bVar16 = pvVar6->type == SMOVE;
    }
    if ((local_429 & 1) != 0) {
      std::__cxx11::string::~string((string *)&i);
    }
    std::__cxx11::string::~string(local_408);
    if (!bVar16) break;
    pvVar7 = std::stack<stackElem,_std::deque<stackElem,_std::allocator<stackElem>_>_>::top
                       ((stack<stackElem,_std::deque<stackElem,_std::allocator<stackElem>_>_> *)
                        &elemprint.super__Vector_base<stackElem,_std::allocator<stackElem>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage);
    local_3b0 = *pvVar7;
    std::__cxx11::string::operator=(local_380,"");
    for (local_430 = 0; uVar8 = (ulong)local_430,
        sVar9 = std::vector<stackElem,_std::allocator<stackElem>_>::size
                          ((vector<stackElem,_std::allocator<stackElem>_> *)formatS), uVar8 < sVar9;
        local_430 = local_430 + 1) {
      pvVar10 = std::vector<stackElem,_std::allocator<stackElem>_>::operator[]
                          ((vector<stackElem,_std::allocator<stackElem>_> *)formatS,(long)local_430)
      ;
      std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::operator[]
                (&this->elements,(long)pvVar10->elemKey);
      std::operator+(local_450,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380)
      ;
      std::__cxx11::string::operator=(local_380,(string *)local_450);
      std::__cxx11::string::~string((string *)local_450);
      std::ios::clear((long)&local_360 + *(long *)(local_360 + -0x18),0);
      pvVar10 = std::vector<stackElem,_std::allocator<stackElem>_>::operator[]
                          ((vector<stackElem,_std::allocator<stackElem>_> *)formatS,(long)local_430)
      ;
      std::ostream::operator<<(local_350,pvVar10->states);
      std::operator>>((basic_istream<char,_std::char_traits<char>_> *)&local_360,local_1d8);
      std::operator+(local_470,(char *)local_380);
      std::__cxx11::string::operator=(local_380,(string *)local_470);
      std::__cxx11::string::~string((string *)local_470);
    }
    uVar11 = std::__cxx11::string::c_str();
    sprintf(local_1d8,formatC + 8,uVar11);
    std::operator+(local_490,(char *)local_3a0);
    std::__cxx11::string::operator=(local_3a0,(string *)local_490);
    std::__cxx11::string::~string((string *)local_490);
    std::__cxx11::string::operator=(local_380,"");
    for (local_494 = e.elemKey; uVar8 = (ulong)local_494,
        sVar9 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_38), uVar8 < sVar9; local_494 = local_494 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_38,(long)local_494);
      std::operator+(local_4b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380)
      ;
      std::__cxx11::string::operator=(local_380,(string *)local_4b8);
      std::__cxx11::string::~string((string *)local_4b8);
    }
    uVar11 = std::__cxx11::string::c_str();
    sprintf(local_1d8,local_f0,uVar11);
    std::operator+(local_4d8,(char *)local_3a0);
    std::__cxx11::string::operator=(local_3a0,(string *)local_4d8);
    std::__cxx11::string::~string((string *)local_4d8);
    pvVar4 = std::
             vector<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
             ::operator[](&this->action_table,(long)local_3b0.states);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_38,(long)e.elemKey);
    std::__cxx11::string::string(local_4f8,(string *)pvVar5);
    iVar3 = find_name(this,(string *)local_4f8);
    pvVar6 = std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>::operator[]
                       (pvVar4,(long)iVar3);
    TVar1 = pvVar6->type;
    std::__cxx11::string::~string(local_4f8);
    switch(TVar1) {
    case SMOVE:
      std::operator+(local_608,(char *)local_3a0);
      std::__cxx11::string::operator=(local_3a0,(string *)local_608);
      std::__cxx11::string::~string((string *)local_608);
      pvVar4 = std::
               vector<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
               ::operator[](&this->action_table,(long)local_3b0.states);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_38,(long)e.elemKey);
      std::__cxx11::string::string(local_628,(string *)pvVar5);
      iVar3 = find_name(this,(string *)local_628);
      pvVar6 = std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>::operator[]
                         (pvVar4,(long)iVar3);
      local_3e4 = (pvVar6->choose).state;
      std::__cxx11::string::~string(local_628);
      std::ios::clear((long)&local_360 + *(long *)(local_360 + -0x18),0);
      std::ostream::operator<<(local_350,local_3e4);
      std::operator>>((basic_istream<char,_std::char_traits<char>_> *)&local_360,local_1d8);
      std::operator+(local_668,(char *)local_3a0);
      std::operator+(local_648,(char *)local_668);
      std::__cxx11::string::operator=(local_3a0,(string *)local_648);
      std::__cxx11::string::~string((string *)local_648);
      std::__cxx11::string::~string((string *)local_668);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_38,(long)e.elemKey);
      std::__cxx11::string::string(local_688,(string *)pvVar5);
      iVar3 = find_name(this,(string *)local_688);
      local_3b0.elemKey = iVar3;
      std::__cxx11::string::~string(local_688);
      local_3b0.states = local_3e4;
      std::stack<stackElem,_std::deque<stackElem,_std::allocator<stackElem>_>_>::push
                ((stack<stackElem,_std::deque<stackElem,_std::allocator<stackElem>_>_> *)
                 &elemprint.super__Vector_base<stackElem,_std::allocator<stackElem>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_3b0);
      std::vector<stackElem,_std::allocator<stackElem>_>::push_back
                ((vector<stackElem,_std::allocator<stackElem>_> *)formatS,&local_3b0);
      e.elemKey = e.elemKey + 1;
      break;
    case REDUCE:
      std::operator+(local_518,(char *)local_3a0);
      std::__cxx11::string::operator=(local_3a0,(string *)local_518);
      std::__cxx11::string::~string((string *)local_518);
      pvVar4 = std::
               vector<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
               ::operator[](&this->action_table,(long)local_3b0.states);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_38,(long)e.elemKey);
      std::__cxx11::string::string(local_538,(string *)pvVar5);
      iVar3 = find_name(this,(string *)local_538);
      pvVar6 = std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>::operator[]
                         (pvVar4,(long)iVar3);
      _iStack_3e0 = pvVar6->choose;
      std::__cxx11::string::~string(local_538);
      std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::operator[]
                (&this->elements,(long)iStack_3e0);
      std::operator+(local_578,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a0)
      ;
      std::operator+(local_558,(char *)local_578);
      std::__cxx11::string::operator=(local_3a0,(string *)local_558);
      std::__cxx11::string::~string((string *)local_558);
      std::__cxx11::string::~string((string *)local_578);
      local_57c = 0;
      while( true ) {
        uVar8 = (ulong)local_57c;
        pvVar12 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
                  operator[](&this->elements,(long)iStack_3e0);
        pvVar13 = std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::
                  operator[](&pvVar12->expression_of_set,(long)st);
        sVar9 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)pvVar13);
        if (sVar9 <= uVar8) break;
        pvVar12 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
                  operator[](&this->elements,(long)iStack_3e0);
        pEVar14 = &std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::
                   operator[](&pvVar12->expression_of_set,(long)st)->super_Express;
        piVar15 = base_grammar::Express::operator[](pEVar14,local_57c);
        if (*piVar15 != -1) {
          pvVar12 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
                    operator[](&this->elements,(long)iStack_3e0);
          pEVar14 = &std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::
                     operator[](&pvVar12->expression_of_set,(long)st)->super_Express;
          piVar15 = base_grammar::Express::operator[](pEVar14,local_57c);
          std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::operator[]
                    (&this->elements,(long)*piVar15);
          std::operator+(local_5a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3a0);
          std::__cxx11::string::operator=(local_3a0,(string *)local_5a0);
          std::__cxx11::string::~string((string *)local_5a0);
        }
        local_57c = local_57c + 1;
      }
      std::operator+(local_5c0,(char *)local_3a0);
      std::__cxx11::string::operator=(local_3a0,(string *)local_5c0);
      std::__cxx11::string::~string((string *)local_5c0);
      local_5c4 = 0;
      while( true ) {
        uVar8 = (ulong)local_5c4;
        pvVar12 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
                  operator[](&this->elements,(long)iStack_3e0);
        pvVar13 = std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::
                  operator[](&pvVar12->expression_of_set,(long)st);
        sVar9 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)pvVar13);
        if (sVar9 <= uVar8) break;
        std::stack<stackElem,_std::deque<stackElem,_std::allocator<stackElem>_>_>::pop
                  ((stack<stackElem,_std::deque<stackElem,_std::allocator<stackElem>_>_> *)
                   &elemprint.super__Vector_base<stackElem,_std::allocator<stackElem>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::vector<stackElem,_std::allocator<stackElem>_>::pop_back
                  ((vector<stackElem,_std::allocator<stackElem>_> *)formatS);
        local_5c4 = local_5c4 + 1;
      }
      pvVar7 = std::stack<stackElem,_std::deque<stackElem,_std::allocator<stackElem>_>_>::top
                         ((stack<stackElem,_std::deque<stackElem,_std::allocator<stackElem>_>_> *)
                          &elemprint.super__Vector_base<stackElem,_std::allocator<stackElem>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      local_3b0 = *pvVar7;
      pvVar4 = std::
               vector<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
               ::operator[](&this->action_table,(long)local_3b0.states);
      pvVar6 = std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>::operator[]
                         (pvVar4,(long)iStack_3e0);
      if (pvVar6->type == ERROR) {
        std::operator+(local_5e8,(char *)local_3a0);
        std::__cxx11::string::operator=(local_3a0,(string *)local_5e8);
        std::__cxx11::string::~string((string *)local_5e8);
      }
      else {
        local_3b0.elemKey = iStack_3e0;
        pvVar4 = std::
                 vector<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                 ::operator[](&this->action_table,(long)local_3b0.states);
        pvVar6 = std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>::operator[]
                           (pvVar4,(long)iStack_3e0);
        local_3b0.states = (pvVar6->choose).state;
        std::stack<stackElem,_std::deque<stackElem,_std::allocator<stackElem>_>_>::push
                  ((stack<stackElem,_std::deque<stackElem,_std::allocator<stackElem>_>_> *)
                   &elemprint.super__Vector_base<stackElem,_std::allocator<stackElem>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_3b0);
        std::vector<stackElem,_std::allocator<stackElem>_>::push_back
                  ((vector<stackElem,_std::allocator<stackElem>_> *)formatS,&local_3b0);
      }
      break;
    case ERROR:
      break;
    case ACC:
    }
  }
  pvVar4 = std::
           vector<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
           ::operator[](&this->action_table,(long)local_3b0.states);
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_38,(long)e.elemKey);
  std::__cxx11::string::string(local_6a8,(string *)pvVar5);
  iVar3 = find_name(this,(string *)local_6a8);
  pvVar6 = std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>::operator[]
                     (pvVar4,(long)iVar3);
  TVar1 = pvVar6->type;
  std::__cxx11::string::~string(local_6a8);
  if (TVar1 == ERROR) {
    ipString.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    std::operator+(local_6c8,(char *)local_3a0);
    std::__cxx11::string::operator=(local_3a0,(string *)local_6c8);
    std::__cxx11::string::~string((string *)local_6c8);
  }
  else {
    std::operator+(local_6e8,(char *)local_3a0);
    std::__cxx11::string::operator=(local_3a0,(string *)local_6e8);
    std::__cxx11::string::~string((string *)local_6e8);
  }
  std::operator<<((ostream *)&std::cout,local_3a0);
  bVar2 = ipString.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
  std::__cxx11::string::~string(local_3a0);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_360);
  std::__cxx11::string::~string((string *)(buffer + 0xc0));
  std::vector<stackElem,_std::allocator<stackElem>_>::~vector
            ((vector<stackElem,_std::allocator<stackElem>_> *)formatS);
  std::stack<stackElem,_std::deque<stackElem,_std::allocator<stackElem>_>_>::~stack
            ((stack<stackElem,_std::deque<stackElem,_std::allocator<stackElem>_>_> *)
             &elemprint.super__Vector_base<stackElem,_std::allocator<stackElem>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return (bool)(bVar2 & 1);
}

Assistant:

bool  GrammarLR::sim(char* testString){

    bool result = true;
    //不使用testString，出现双字符串无法解释;
    vector<string> ipString;
    public_tool::parse_elem(testString, ipString);

    stack<stackElem> s;//指导栈
    vector<stackElem> elemprint;//输出作用
    char formatS[] = "%-25s";//栈的格式
    char formatC[] = "%+15s         ";//字母格式的格式
    string bufS;
    char buffer[200];		//格式化的辅助
    stringstream sstream;
    string tmp;				//字符串中间
    string text;			//输出的串
    int ipIndex = 0;//ip的指向

    stackElem e;
    e.elemKey = find_name("#");//#是开始字符
    e.states = 0;//0是初态
    s.push(e);
    elemprint.push_back(e);
    ReduceByExpress r;
    int st;
    while (action_table[e.states][find_name(ipString[ipIndex])].type == REDUCE || action_table[e.states][find_name(
            ipString[ipIndex])].type == SMOVE){
        e = s.top();

        //1.输出栈
        tmp = "";
        for (int i = 0; i < elemprint.size(); i++){
            tmp = tmp + elements[elemprint[i].elemKey].name;
            sstream.clear();
            sstream << elemprint[i].states;
            sstream >> buffer;
            tmp = tmp + buffer;
        }
        sprintf(buffer, formatS, tmp.c_str());
        text = text + buffer;
        //2.当前输入
        tmp = "";
        for (int i = ipIndex; i < ipString.size(); i++){
            tmp = tmp + ipString[i];
        }
        sprintf(buffer, formatC, tmp.c_str());
        text = text + buffer;

        switch (action_table[e.states][find_name(ipString[ipIndex])].type)
        {
            //不会出现
            case ERROR: break;

            case REDUCE:
                //归约操作
                //3.进行的动作
                text = text + "REDUCE:";
                //get表达式
                r = action_table[e.states][find_name(ipString[ipIndex])].choose.R;
                text = text + elements[r.elemIndex].name + "->";
                for (int i = 0; i < elements[r.elemIndex].expression_of_set[r.expressIndex].expression.size(); i++){
                    if (elements[r.elemIndex].expression_of_set[r.expressIndex][i] == -1){ continue; }
                    text = text + elements[elements[r.elemIndex].expression_of_set[r.expressIndex][i]].name;
                }
                text = text + "\n";

                //出栈
                for (int i = 0; i < elements[r.elemIndex].expression_of_set[r.expressIndex].expression.size(); i++){
                    s.pop();
                    elemprint.pop_back();
                }
                //替换终结符操作
                e = s.top();
                if (action_table[e.states][r.elemIndex].type == ERROR){
                    text = text + "ERROR";
                    break;//跳出swtich
                }
                e.elemKey = r.elemIndex;
                e.states = action_table[e.states][r.elemIndex].choose.state;
                s.push(e);
                elemprint.push_back(e);
                break;
            case SMOVE:
                //3.进行的动作
                text = text + "SMOVE:";
                //get表达式
                st = action_table[e.states][find_name(ipString[ipIndex])].choose.state;
                sstream.clear();
                sstream << st;
                sstream >> buffer;
                text = text + buffer + "\n";

                //入栈就行
                e.elemKey = find_name(ipString[ipIndex]);
                e.states = st;
                s.push(e);
                elemprint.push_back(e);
                ipIndex++;
                break;
                //不会出现
            case ACC: break;
            default:
                break;
        }
    }


    if (action_table[e.states][find_name(ipString[ipIndex])].type == ERROR) {
        result = false;
        text = text + "ERROR\n";
    }
    else
    {
        text = text + "ACC\n";
    }
    cout << text;
    return result;
}